

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall
cmMakefile::EnforceUniqueName(cmMakefile *this,string *name,string *msg,bool isCustom)

{
  bool bVar1;
  bool bVar2;
  PolicyStatus PVar3;
  TargetType TVar4;
  cmTarget *this_00;
  cmMakefile *pcVar5;
  cmState *this_01;
  ostream *poVar6;
  string *psVar7;
  PolicyID id;
  bool local_5d5;
  string local_580 [32];
  undefined1 local_560 [8];
  ostringstream e_1;
  allocator<char> local_3e1;
  string local_3e0;
  cmake *local_3c0;
  cmake *cm;
  string local_398;
  string local_378 [32];
  ostringstream local_358 [8];
  ostringstream e_2;
  cmTarget *existing;
  ostringstream local_1a8 [8];
  ostringstream e;
  bool isCustom_local;
  string *msg_local;
  string *name_local;
  cmMakefile *this_local;
  
  bVar2 = IsAlias(this,name);
  if (bVar2) {
    std::__cxx11::ostringstream::ostringstream(local_1a8);
    poVar6 = std::operator<<((ostream *)local_1a8,"cannot create target \"");
    poVar6 = std::operator<<(poVar6,(string *)name);
    std::operator<<(poVar6,"\" because an alias with the same name already exists.");
    std::__cxx11::ostringstream::str();
    std::__cxx11::string::operator=((string *)msg,(string *)&existing);
    std::__cxx11::string::~string((string *)&existing);
    this_local._7_1_ = false;
    std::__cxx11::ostringstream::~ostringstream(local_1a8);
  }
  else {
    this_00 = FindTargetToUse(this,name,false);
    if (this_00 == (cmTarget *)0x0) {
      this_local._7_1_ = true;
    }
    else {
      bVar2 = cmTarget::IsImported(this_00);
      if (bVar2) {
        std::__cxx11::ostringstream::ostringstream(local_358);
        poVar6 = std::operator<<((ostream *)local_358,"cannot create target \"");
        poVar6 = std::operator<<(poVar6,(string *)name);
        std::operator<<(poVar6,"\" because an imported target with the same name already exists.");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)msg,local_378);
        std::__cxx11::string::~string(local_378);
        this_local._7_1_ = false;
        std::__cxx11::ostringstream::~ostringstream(local_358);
      }
      else {
        PVar3 = GetPolicyStatus(this,CMP0002,false);
        switch(PVar3) {
        case WARN:
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_398,(cmPolicies *)0x2,id);
          IssueMessage(this,AUTHOR_WARNING,&local_398);
          std::__cxx11::string::~string((string *)&local_398);
        case OLD:
          this_local._7_1_ = true;
          break;
        case NEW:
        default:
          local_3c0 = GetCMakeInstance(this);
          bVar1 = false;
          bVar2 = false;
          local_5d5 = false;
          if (isCustom) {
            TVar4 = cmTarget::GetType(this_00);
            local_5d5 = false;
            if (TVar4 == UTILITY) {
              pcVar5 = cmTarget::GetMakefile(this_00);
              local_5d5 = false;
              if (this != pcVar5) {
                this_01 = cmake::GetState(local_3c0);
                std::allocator<char>::allocator();
                bVar1 = true;
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3e0,"ALLOW_DUPLICATE_CUSTOM_TARGETS",&local_3e1);
                bVar2 = true;
                local_5d5 = cmState::GetGlobalPropertyAsBool(this_01,&local_3e0);
              }
            }
          }
          if (bVar2) {
            std::__cxx11::string::~string((string *)&local_3e0);
          }
          if (bVar1) {
            std::allocator<char>::~allocator(&local_3e1);
          }
          if (local_5d5 == false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_560);
            poVar6 = std::operator<<((ostream *)local_560,"cannot create target \"");
            poVar6 = std::operator<<(poVar6,(string *)name);
            poVar6 = std::operator<<(poVar6,
                                     "\" because another target with the same name already exists.  "
                                    );
            std::operator<<(poVar6,"The existing target is ");
            TVar4 = cmTarget::GetType(this_00);
            switch(TVar4) {
            case EXECUTABLE:
              std::operator<<((ostream *)local_560,"an executable ");
              break;
            case STATIC_LIBRARY:
              std::operator<<((ostream *)local_560,"a static library ");
              break;
            case SHARED_LIBRARY:
              std::operator<<((ostream *)local_560,"a shared library ");
              break;
            case MODULE_LIBRARY:
              std::operator<<((ostream *)local_560,"a module library ");
              break;
            default:
              break;
            case UTILITY:
              std::operator<<((ostream *)local_560,"a custom target ");
              break;
            case INTERFACE_LIBRARY:
              std::operator<<((ostream *)local_560,"an interface library ");
            }
            poVar6 = std::operator<<((ostream *)local_560,"created in source directory \"");
            pcVar5 = cmTarget::GetMakefile(this_00);
            psVar7 = GetCurrentSourceDirectory_abi_cxx11_(pcVar5);
            poVar6 = std::operator<<(poVar6,(string *)psVar7);
            poVar6 = std::operator<<(poVar6,"\".  ");
            std::operator<<(poVar6,"See documentation for policy CMP0002 for more details.");
            std::__cxx11::ostringstream::str();
            std::__cxx11::string::operator=((string *)msg,local_580);
            std::__cxx11::string::~string(local_580);
            this_local._7_1_ = false;
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_560);
          }
          else {
            this_local._7_1_ = true;
          }
          break;
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)&cm,(cmPolicies *)0x2,id);
          IssueMessage(this,FATAL_ERROR,(string *)&cm);
          std::__cxx11::string::~string((string *)&cm);
          this_local._7_1_ = true;
        }
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

bool cmMakefile::EnforceUniqueName(std::string const& name, std::string& msg,
                                   bool isCustom) const
{
  if (this->IsAlias(name)) {
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because an alias with the same name already exists.";
    msg = e.str();
    return false;
  }
  if (cmTarget* existing = this->FindTargetToUse(name)) {
    // The name given conflicts with an existing target.  Produce an
    // error in a compatible way.
    if (existing->IsImported()) {
      // Imported targets were not supported in previous versions.
      // This is new code, so we can make it an error.
      std::ostringstream e;
      e << "cannot create target \"" << name
        << "\" because an imported target with the same name already exists.";
      msg = e.str();
      return false;
    }
    // target names must be globally unique
    switch (this->GetPolicyStatus(cmPolicies::CMP0002)) {
      case cmPolicies::WARN:
        this->IssueMessage(MessageType::AUTHOR_WARNING,
                           cmPolicies::GetPolicyWarning(cmPolicies::CMP0002));
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        return true;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        this->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0002));
        return true;
      case cmPolicies::NEW:
        break;
    }

    // The conflict is with a non-imported target.
    // Allow this if the user has requested support.
    cmake* cm = this->GetCMakeInstance();
    if (isCustom && existing->GetType() == cmStateEnums::UTILITY &&
        this != existing->GetMakefile() &&
        cm->GetState()->GetGlobalPropertyAsBool(
          "ALLOW_DUPLICATE_CUSTOM_TARGETS")) {
      return true;
    }

    // Produce an error that tells the user how to work around the
    // problem.
    std::ostringstream e;
    e << "cannot create target \"" << name
      << "\" because another target with the same name already exists.  "
      << "The existing target is ";
    switch (existing->GetType()) {
      case cmStateEnums::EXECUTABLE:
        e << "an executable ";
        break;
      case cmStateEnums::STATIC_LIBRARY:
        e << "a static library ";
        break;
      case cmStateEnums::SHARED_LIBRARY:
        e << "a shared library ";
        break;
      case cmStateEnums::MODULE_LIBRARY:
        e << "a module library ";
        break;
      case cmStateEnums::UTILITY:
        e << "a custom target ";
        break;
      case cmStateEnums::INTERFACE_LIBRARY:
        e << "an interface library ";
        break;
      default:
        break;
    }
    e << "created in source directory \""
      << existing->GetMakefile()->GetCurrentSourceDirectory() << "\".  "
      << "See documentation for policy CMP0002 for more details.";
    msg = e.str();
    return false;
  }
  return true;
}